

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O3

int dwarf_get_aranges(Dwarf_Debug dbg,Dwarf_Arange **aranges,Dwarf_Signed *returned_count,
                     Dwarf_Error *error)

{
  byte *pbVar1;
  byte *end_arange;
  byte bVar2;
  Dwarf_Chain pDVar3;
  byte *pbVar4;
  Dwarf_Error *error_00;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  Dwarf_Arange *ppDVar9;
  ulong uVar10;
  Dwarf_Signed errval;
  Dwarf_Unsigned DVar11;
  ulong uVar12;
  dwarfstring_u v;
  Dwarf_Unsigned DVar13;
  int readlength;
  Dwarf_Chain_conflict head;
  Dwarf_Chain_conflict head_chain;
  byte *local_d0;
  int local_length_size;
  int local_extension_size;
  char *local_c0;
  Dwarf_Error *local_b8;
  Dwarf_Unsigned local_b0;
  ulong local_a8;
  Dwarf_Unsigned area_length;
  Dwarf_Off info_offset;
  byte *local_90;
  Dwarf_Unsigned range_length;
  Dwarf_Unsigned version;
  Dwarf_Arange **local_78;
  Dwarf_Unsigned *local_70;
  byte *local_68;
  Dwarf_Unsigned local_60;
  ulong local_58;
  Dwarf_Addr range_address;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_aranges()either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  iVar5 = _dwarf_load_section(dbg,&dbg->de_debug_aranges,error);
  if (iVar5 != 0) {
    return iVar5;
  }
  iVar5 = _dwarf_load_debug_info(dbg,error);
  if (iVar5 != 0) {
    return iVar5;
  }
  version = 0;
  info_offset = 0;
  head_chain = (Dwarf_Chain_conflict)0x0;
  DVar11 = (dbg->de_debug_aranges).dss_size;
  if (DVar11 != 0) {
    local_d0 = (dbg->de_debug_aranges).dss_data;
    local_90 = local_d0 + DVar11;
    DVar13 = 0;
    local_c0 = (char *)&head_chain;
    local_70 = (Dwarf_Unsigned *)returned_count;
    local_68 = local_d0;
    local_60 = DVar11;
LAB_001958c3:
    pbVar4 = local_d0;
    area_length = 0;
    local_extension_size = 0;
    if (local_90 <= local_d0) goto LAB_00195c56;
    iVar5 = _dwarf_read_area_length_ck_wrapper
                      (dbg,&area_length,&local_d0,&local_length_size,&local_extension_size,local_60,
                       local_90,error);
    if (iVar5 != 0) {
LAB_00195c42:
      free_aranges_chain(dbg,head_chain);
      goto LAB_00195cef;
    }
    uVar6 = (dbg->de_debug_aranges).dss_size;
    if (((area_length <= uVar6) &&
        ((long)local_extension_size + (long)local_length_size + area_length <= uVar6)) &&
       (end_arange = local_d0 + area_length, local_b0 = DVar13, end_arange <= local_90)) {
      pbVar1 = local_d0;
      if (area_length == 0) {
LAB_00195bee:
        local_d0 = pbVar1;
        DVar11 = local_b0;
        head = head_chain;
        DVar13 = local_b0;
        if (local_90 <= local_d0) goto code_r0x00195c18;
        goto LAB_001958c3;
      }
      iVar5 = _dwarf_read_unaligned_ck_wrapper(dbg,&version,local_d0,2,end_arange,error);
      if (iVar5 != 0) goto LAB_00195c42;
      local_d0 = local_d0 + 2;
      if (end_arange <= local_d0) goto LAB_00195c56;
      if (version != 2) {
        free_aranges_chain(dbg,head_chain);
        errval = 0x30;
        goto LAB_00195ce4;
      }
      iVar5 = _dwarf_read_unaligned_ck_wrapper
                        (dbg,&info_offset,local_d0,local_length_size,end_arange,error);
      if (iVar5 != 0) goto LAB_00195c42;
      local_d0 = local_d0 + local_length_size;
      if (local_d0 < end_arange) {
        pbVar1 = local_d0;
        if (info_offset < (dbg->de_debug_info).dss_size) {
          bVar2 = *local_d0;
          uVar6 = (ulong)bVar2;
          if (8 < bVar2) {
            free_aranges_chain(dbg,head_chain);
            errval = 0x32;
            goto LAB_00195ce4;
          }
          local_a8 = uVar6;
          if (uVar6 == 0) {
            free_aranges_chain(dbg,head_chain);
            errval = 0x173;
            goto LAB_00195ce4;
          }
          pbVar1 = local_d0 + 1;
          if (pbVar1 < end_arange) {
            if (*pbVar1 != 0) {
              local_d0 = pbVar1;
              free_aranges_chain(dbg,head_chain);
              _dwarf_error_string(dbg,error,0x87,
                                  "DW_DLE_SEGMENT_SIZE_BAD: segment selector size > 0 is not supported"
                                 );
              goto LAB_00195ce9;
            }
            local_d0 = local_d0 + 2;
            pbVar1 = local_d0;
            if (local_d0 <= end_arange) {
              uVar12 = (ulong)((uint)bVar2 * 2);
              uVar10 = (ulong)((long)local_d0 - (long)pbVar4) % uVar12;
              local_b8 = error;
              local_78 = aranges;
              local_58 = uVar6;
              if (uVar10 != 0) {
                local_d0 = local_d0 + (uVar12 - uVar10);
              }
              do {
                error_00 = local_b8;
                range_address = 0;
                range_length = 0;
                readlength = (int)local_a8;
                iVar5 = _dwarf_read_unaligned_ck_wrapper
                                  (dbg,&range_address,local_d0,readlength,end_arange,local_b8);
                uVar6 = local_58;
                if (iVar5 != 0) goto LAB_00195c42;
                local_d0 = local_d0 + local_58;
                iVar5 = _dwarf_read_unaligned_ck_wrapper
                                  (dbg,&range_length,local_d0,readlength,end_arange,error_00);
                if (iVar5 != 0) goto LAB_00195c42;
                local_d0 = local_d0 + uVar6;
                pcVar7 = _dwarf_get_alloc(dbg,'\x11',1);
                if (pcVar7 == (char *)0x0) {
LAB_00195c79:
                  free_aranges_chain(dbg,head_chain);
                  errval = 0x3e;
                  error = local_b8;
                  goto LAB_00195ce4;
                }
                pcVar7[0] = '\0';
                pcVar7[1] = '\0';
                pcVar7[2] = '\0';
                pcVar7[3] = '\0';
                pcVar7[4] = '\0';
                pcVar7[5] = '\0';
                pcVar7[6] = '\0';
                pcVar7[7] = '\0';
                pcVar7[0x28] = '\0';
                pcVar7[0x29] = '\0';
                *(Dwarf_Addr *)(pcVar7 + 8) = range_address;
                *(Dwarf_Unsigned *)(pcVar7 + 0x10) = range_length;
                *(Dwarf_Off *)(pcVar7 + 0x18) = info_offset;
                *(Dwarf_Debug *)(pcVar7 + 0x20) = dbg;
                pcVar8 = _dwarf_get_alloc(dbg,'\x1f',1);
                if (pcVar8 == (char *)0x0) {
                  dwarf_dealloc(dbg,pcVar7,0x11);
                  goto LAB_00195c79;
                }
                local_b0 = local_b0 + 1;
                *(char **)pcVar8 = pcVar7;
                pcVar8[8] = '\x11';
                pcVar8[9] = '\0';
                pcVar8[10] = '\0';
                pcVar8[0xb] = '\0';
                *(char **)local_c0 = pcVar8;
                error = local_b8;
                pcVar8 = pcVar8 + 0x10;
                local_c0 = pcVar8;
              } while (local_d0 + uVar12 <= end_arange);
              aranges = local_78;
              pbVar1 = end_arange;
              if (end_arange < local_d0) {
                local_c0 = (char *)((long)local_d0 - (long)end_arange);
                v = (long)local_d0 - (long)local_68;
                dwarfstring_constructor((dwarfstring_s *)&range_address);
                dwarfstring_append_printf_u
                          ((dwarfstring_s *)&range_address,"DW_DLE_ARANGE_LENGTH_BAD. 0x%08llx",
                           (dwarfstring_u)local_c0);
                dwarfstring_append_printf_u
                          ((dwarfstring_s *)&range_address,
                           " pad bytes at offset 0x%08llx in .debug_aranges",v);
                pcVar7 = dwarfstring_string((dwarfstring_s *)&range_address);
                dwarf_insert_harmless_error(dbg,pcVar7);
                dwarfstring_destructor((dwarfstring_s *)&range_address);
                aranges = local_78;
                local_c0 = pcVar8;
              }
              goto LAB_00195bee;
            }
          }
        }
        local_d0 = pbVar1;
        free_aranges_chain(dbg,head_chain);
        errval = 0x86;
        goto LAB_00195ce4;
      }
    }
LAB_00195c56:
    free_aranges_chain(dbg,head_chain);
    errval = 0x14f;
    goto LAB_00195ce4;
  }
  iVar5 = -1;
LAB_00195cef:
  free_aranges_chain(dbg,(Dwarf_Chain_conflict)0x0);
  return iVar5;
code_r0x00195c18:
  if (local_d0 == local_90) {
    ppDVar9 = (Dwarf_Arange *)_dwarf_get_alloc(dbg,'\x0f',local_b0);
    if (ppDVar9 == (Dwarf_Arange *)0x0) {
      _dwarf_error(dbg,error,0x3e);
      free_aranges_chain(dbg,head);
      return 1;
    }
    if (0 < (long)DVar11) {
      DVar13 = 0;
      do {
        ppDVar9[DVar13] = (Dwarf_Arange)head->ch_item;
        head->ch_item = (void *)0x0;
        pDVar3 = head->ch_next;
        dwarf_dealloc(dbg,head,0x1f);
        DVar13 = DVar13 + 1;
        DVar11 = local_b0;
        head = pDVar3;
      } while (local_b0 != DVar13);
    }
    *aranges = ppDVar9;
    *local_70 = DVar11;
    return 0;
  }
  free_aranges_chain(dbg,head_chain);
  errval = 0x89;
LAB_00195ce4:
  _dwarf_error(dbg,error,errval);
LAB_00195ce9:
  iVar5 = 1;
  goto LAB_00195cef;
}

Assistant:

int
dwarf_get_aranges(Dwarf_Debug dbg,
    Dwarf_Arange ** aranges,
    Dwarf_Signed * returned_count, Dwarf_Error * error)
{
    /* Count of total number of aranges. */
    Dwarf_Signed arange_count = 0;

    Dwarf_Arange *arange_block = 0;

    /* Used to chain Dwarf_Aranges structs. */
    Dwarf_Chain curr_chain = NULL;
    Dwarf_Chain head_chain = NULL;
    Dwarf_Signed i = 0;
    int res = DW_DLV_ERROR;

    /* ***** BEGIN CODE ***** */

    CHECK_DBG(dbg,error,"dwarf_get_aranges()");
    res = _dwarf_load_section(dbg, &dbg->de_debug_aranges, error);
    if (res != DW_DLV_OK) {
        return res;
    }
    /*  aranges points in to info, so if info needs expanding
        we have to load it. */
    res = _dwarf_load_debug_info(dbg, error);
    if (res != DW_DLV_OK) {
        return res;
    }

    res = _dwarf_get_aranges_list(dbg,&head_chain,
        &arange_count,error);
    if (res != DW_DLV_OK) {
        free_aranges_chain(dbg,head_chain);
        return res;
    }

    arange_block = (Dwarf_Arange *)
        _dwarf_get_alloc(dbg, DW_DLA_LIST, arange_count);
    if (arange_block == NULL) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        free_aranges_chain(dbg,head_chain);
        return DW_DLV_ERROR;
    }

    /* See also free_aranges_chain() above */
    curr_chain = head_chain;
    for (i = 0; i < arange_count; i++) {
        Dwarf_Chain prev = 0;

        /*  Copies pointers. No dealloc of ch_item, */
        *(arange_block + i) = curr_chain->ch_item;
        curr_chain->ch_item = 0;
        prev = curr_chain;
        curr_chain = curr_chain->ch_next;
        dwarf_dealloc(dbg, prev, DW_DLA_CHAIN);
    }
    *aranges = arange_block;
    *returned_count = (arange_count);
    return DW_DLV_OK;
}